

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void shieldeff(xchar x,xchar y)

{
  uint uVar1;
  int iVar2;
  
  if (('\0' < flags.sparkle) && ((viz_array[y][x] & 2U) != 0)) {
    uVar1 = (uint)x;
    iVar2 = 0;
    do {
      if ((byte)y < 0x15 && uVar1 - 1 < 0x4f) {
        dbuf[(byte)y][uVar1].effect = shield_static[iVar2] + 1U | 0x40000;
      }
      flush_screen();
      (*windowprocs.win_delay)();
      iVar2 = iVar2 + flags.sparkle;
    } while (iVar2 < 0x15);
    if ((byte)y < 0x15 && uVar1 - 1 < 0x4f) {
      dbuf[(byte)y][uVar1].effect = 0;
    }
  }
  return;
}

Assistant:

void shieldeff(xchar x, xchar y)
{
    int i;

    if (flags.sparkle <= 0)
	return;

    if (cansee(x,y)) {	/* Don't see anything if can't see the location */
	for (i = 0; i < SHIELD_COUNT; i += flags.sparkle) {
	    dbuf_set_effect(x, y, dbuf_effect(E_MISC, shield_static[i]));
	    flush_screen();	/* make sure the effect shows up */
	    win_delay_output();
	}

	dbuf_set_effect(x, y, 0);
    }
}